

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DOMNodeIteratorImpl::acceptNode(DOMNodeIteratorImpl *this,DOMNode *node)

{
  DOMNodeFilter *pDVar1;
  int iVar2;
  ulong uVar3;
  DOMException *this_00;
  DOMNode *pDVar4;
  bool bVar5;
  
  if (this->fDetached != true) {
    pDVar1 = this->fNodeFilter;
    uVar3 = this->fWhatToShow;
    iVar2 = (*node->_vptr_DOMNode[4])(node);
    uVar3 = (long)(1 << ((char)iVar2 - 1U & 0x1f)) & uVar3;
    if (pDVar1 == (DOMNodeFilter *)0x0) {
      bVar5 = uVar3 != 0;
    }
    else if (uVar3 == 0) {
      bVar5 = false;
    }
    else {
      iVar2 = (**(code **)(*(long *)this->fNodeFilter + 0x10))(this->fNodeFilter,node);
      bVar5 = iVar2 == 1;
    }
    return bVar5;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDocument == (DOMDocument *)0x0) {
    pDVar4 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar4 = &this->fDocument[10].super_DOMNode;
  }
  DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar4->_vptr_DOMNode);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

bool DOMNodeIteratorImpl::acceptNode (DOMNode* node) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    if (fNodeFilter == 0) {
        return ((fWhatToShow & (1 << (node->getNodeType() - 1))) != 0);
    } else {
        return ((fWhatToShow & (1 << (node->getNodeType() - 1))) != 0)
            && fNodeFilter->acceptNode(node) == DOMNodeFilter::FILTER_ACCEPT;
    }
}